

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool P_CheckMissileSpawn(AActor *th,double maxdist)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  DVector2 local_c8;
  FCheckPosition tm;
  
  if ((((th->flags4).Value & 0x10) != 0) && (0 < th->tics)) {
    uVar2 = FRandom::operator()(&pr_checkmissilespawn);
    iVar4 = th->tics - (uVar2 & 3);
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    th->tics = iVar3;
  }
  if (0.0 < maxdist) {
    dVar7 = (th->Vel).X;
    dVar8 = (th->Vel).Y;
    dVar6 = (th->Vel).Z;
    do {
      dVar7 = dVar7 * 0.5;
      dVar8 = dVar8 * 0.5;
      dVar6 = dVar6 * 0.5;
    } while (maxdist * maxdist <= dVar8 * dVar8 + dVar7 * dVar7);
    (th->__Pos).Z = dVar6 + (th->__Pos).Z;
    (th->__Pos).X = dVar7 + (th->__Pos).X;
    (th->__Pos).Y = dVar8 + (th->__Pos).Y;
  }
  FCheckPosition::FCheckPosition(&tm,(bool)((byte)((th->flags2).Value >> 8) & 1));
  bVar5 = 1;
  if (((th->flags).Value & 0x10000) != 0) {
    bVar5 = (*(byte *)((long)&(th->BounceFlags).Value + 1) & 0x10) >> 4;
  }
  local_c8.X = (th->__Pos).X;
  local_c8.Y = (th->__Pos).Y;
  bVar1 = P_TryMove(th,&local_c8,0,(secplane_t *)0x0,&tm,true);
  if ((bVar1) ||
     (((th->BlockingMobj != (AActor *)0x0 && (((th->flags2).Value & 0x100) != 0)) &&
      (((th->BlockingMobj->flags5).Value & 0x80000) == 0)))) {
    bVar1 = true;
    AActor::ClearInterpolation(th);
    goto LAB_0042eb6f;
  }
  AActor::ClearCounters(th);
  if (th->BlockingLine == (line_t *)0x0) {
LAB_0042eb5b:
    bVar1 = false;
    P_ExplodeMissile(th,(line_t_conflict *)0x0,th->BlockingMobj);
  }
  else {
    if (th->BlockingLine->special == 9) {
      (*(th->super_DThinker).super_DObject._vptr_DObject[4])(th);
    }
    else {
      if (bVar5 == 0) goto LAB_0042eb5b;
      P_BounceWall(th);
    }
    bVar1 = false;
  }
LAB_0042eb6f:
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&tm.LastRipped);
  return bVar1;
}

Assistant:

bool P_CheckMissileSpawn (AActor* th, double maxdist)
{
	// [RH] Don't decrement tics if they are already less than 1
	if ((th->flags4 & MF4_RANDOMIZE) && th->tics > 0)
	{
		th->tics -= pr_checkmissilespawn() & 3;
		if (th->tics < 1)
			th->tics = 1;
	}

	if (maxdist > 0)
	{
		// move a little forward so an angle can be computed if it immediately explodes
		DVector3 advance = th->Vel;
		double maxsquared = maxdist*maxdist;

		// Keep halving the advance vector until we get something less than maxdist
		// units away, since we still want to spawn the missile inside the shooter.
		do
		{
			advance *= 0.5f;
		}
		while (advance.XY().LengthSquared() >= maxsquared);
		th->SetXYZ(th->Pos() + advance);
	}

	FCheckPosition tm(!!(th->flags2 & MF2_RIP));

	// killough 8/12/98: for non-missile objects (e.g. grenades)
	// 
	// [GZ] MBF excludes non-missile objects from the P_TryMove test
	// and subsequent potential P_ExplodeMissile call. That is because
	// in MBF, a projectile is not an actor with the MF_MISSILE flag
	// but an actor with either or both the MF_MISSILE and MF_BOUNCES
	// flags, and a grenade is identified by not having MF_MISSILE.
	// Killough wanted grenades not to explode directly when spawned,
	// therefore they can be fired safely even when humping a wall as
	// they will then just drop on the floor at their shooter's feet.
	//
	// However, ZDoom does allow non-missiles to be shot as well, so
	// Killough's check for non-missiles is inadequate here. So let's
	// replace it by a check for non-missile and MBF bounce type.
	// This should allow MBF behavior where relevant without altering
	// established ZDoom behavior for crazy stuff like a cacodemon cannon.
	bool MBFGrenade = (!(th->flags & MF_MISSILE) || (th->BounceFlags & BOUNCE_MBF));

	// killough 3/15/98: no dropoff (really = don't care for missiles)
	if (!(P_TryMove (th, th->Pos(), false, NULL, tm, true)))
	{
		// [RH] Don't explode ripping missiles that spawn inside something
		if (th->BlockingMobj == NULL || !(th->flags2 & MF2_RIP) || (th->BlockingMobj->flags5 & MF5_DONTRIP))
		{
			// If this is a monster spawned by A_SpawnProjectile subtract it from the counter.
			th->ClearCounters();
			// [RH] Don't explode missiles that spawn on top of horizon lines
			if (th->BlockingLine != NULL && th->BlockingLine->special == Line_Horizon)
			{
				th->Destroy ();
			}
			else if (MBFGrenade && th->BlockingLine != NULL)
			{
				P_BounceWall(th);
			}
			else
			{
				P_ExplodeMissile (th, NULL, th->BlockingMobj);
			}
			return false;
		}
	}
	th->ClearInterpolation();
	return true;
}